

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivar.c
# Opt level: O0

void object_setIvar(id object,Ivar ivar,id value)

{
  objc_ivar_ownership oVar1;
  ptrdiff_t pVar2;
  id_conflict *addr_00;
  id *addr;
  id value_local;
  Ivar ivar_local;
  id object_local;
  
  pVar2 = ivar_getOffset(ivar);
  addr_00 = (id_conflict *)((long)&object->isa + pVar2);
  oVar1 = ivarGetOwnership(ivar);
  switch(oVar1) {
  case ownership_invalid:
  case ownership_unsafe:
    *addr_00 = (id_conflict)value;
    break;
  case ownership_strong:
    objc_storeStrong(addr_00,(id_conflict)value);
    break;
  case ownership_weak:
    objc_storeWeak(addr_00,(id_conflict)value);
  }
  return;
}

Assistant:

void object_setIvar(id object, Ivar ivar, id value)
{
	id *addr = (id*)((char*)object + ivar_getOffset(ivar));
	switch (ivarGetOwnership(ivar))
	{
		case ownership_strong:
			objc_storeStrong(addr, value);
			break;
		case ownership_weak:
			objc_storeWeak(addr, value);
			break;
		case ownership_unsafe:
		case ownership_invalid:
			*addr = value;
			break;
	}
}